

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O1

int __thiscall deqp::gles31::Functional::FboColorTests::init(FboColorTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format;
  Context *context;
  int extraout_EAX;
  TestNode *node;
  FboTestCase *this_00;
  char *name;
  long lVar1;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texcubearray"
             ,"Cube map array texture tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar1 = 0;
  do {
    this_00 = (FboTestCase *)operator_new(0x98);
    context = (this->super_TestCaseGroup).m_context;
    format = *(deUint32 *)((long)init::colorFormats + lVar1);
    name = FboTestUtil::getFormatName(format);
    FboTestCase::FboTestCase(this_00,context,name,glcts::fixed_sample_locations_values + 1,false);
    *(deUint32 *)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = format;
    (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_021ac5c0;
    *(undefined8 *)
     ((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x8000000080;
    *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
         0xc;
    tcu::TestNode::addChild(node,(TestNode *)this_00);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x90);
  return extraout_EAX;
}

Assistant:

void FboColorTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F,

		// GL_EXT_color_buffer_half_float
		GL_RGB16F
	};

	// .texcubearray
	{
		tcu::TestCaseGroup* texCubeArrayGroup = new tcu::TestCaseGroup(m_testCtx, "texcubearray", "Cube map array texture tests");
		addChild(texCubeArrayGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			texCubeArrayGroup->addChild(new FboColorTexCubeArrayCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
																	 colorFormats[fmtNdx], IVec3(128, 128, 12)));
	}
}